

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framebuffer.cpp
# Opt level: O0

void __thiscall image::Framebuffer::save_buffer(Framebuffer *this,string *name)

{
  ostream *poVar1;
  int local_22c;
  int local_228;
  int x;
  int y;
  ostream local_218 [8];
  ofstream output;
  string *name_local;
  Framebuffer *this_local;
  
  std::ofstream::ofstream(local_218,(string *)name,_S_trunc);
  poVar1 = std::operator<<(local_218,"P3");
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_width);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_height);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xff);
  std::operator<<(poVar1,'\n');
  for (local_228 = 0; local_228 < this->m_height; local_228 = local_228 + 1) {
    for (local_22c = 0; local_22c < this->m_width; local_22c = local_22c + 1) {
      operator<<(local_218,this->m_buffer[local_228] + local_22c);
    }
    std::operator<<(local_218,'\n');
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void image::Framebuffer::save_buffer(const std::string &name)
{
    std::ofstream output(name, std::ofstream::trunc);

    // standard P3 output
    output << "P3" << '\n' 
	   << m_width << ' ' << m_height << '\n' 
	   << 255 << '\n';
    for (int y = 0; y < m_height; y++)
    {
	for (int x = 0; x < m_width; x++)
	{
	    output << m_buffer[y][x];
	}
	output << '\n';
    }

    output.close();
}